

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

CType google::protobuf::compiler::cpp::EffectiveStringCType(FieldDescriptor *field,Options *options)

{
  CType CVar1;
  
  CVar1 = FieldOptions_CType_STRING;
  if (options->opensource_runtime == false) {
    CVar1 = *(CType *)(*(long *)(field + 0x78) + 0x48);
  }
  return CVar1;
}

Assistant:

FieldOptions::CType EffectiveStringCType(const FieldDescriptor* field,
                                         const Options& options) {
  GOOGLE_DCHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  if (options.opensource_runtime) {
    // Open-source protobuf release only supports STRING ctype.
    return FieldOptions::STRING;
  } else {
    // Google-internal supports all ctypes.
    return field->options().ctype();
  }
}